

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  Layer *pLVar2;
  long lVar3;
  ParamDict pd;
  ModelBinFromMatArray local_168;
  Mat bottom_blob_bordered;
  Mat local_110;
  Mat local_c8;
  Mat local_80;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar1 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar1;
  }
  if ((bottom_blob->dims == 1) &&
     (((this->kernel_w == 1 && (this->kernel_h == 1)) &&
      (bottom_blob->elempack * bottom_blob->w == this->weight_data_size / this->num_output)))) {
    pLVar2 = create_layer(0xf);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,this->num_output);
    ParamDict::set(&pd,1,this->bias_term);
    ParamDict::set(&pd,2,this->weight_data_size);
    ParamDict::set(&pd,8,this->int8_scale_term);
    ParamDict::set(&pd,9,this->activation_type);
    ParamDict::set(&pd,10,&this->activation_params);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
    lVar3 = 0x40;
    do {
      *(undefined8 *)((long)&bottom_blob_bordered.data + lVar3) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe68 + lVar3) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe70 + lVar3) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe74 + lVar3) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe7c + lVar3) = 0;
      *(undefined8 *)((long)&pd._vptr_ParamDict + lVar3) = 0;
      *(undefined8 *)((long)&pd.d + lVar3) = 0;
      *(undefined8 *)((long)&pd.d + lVar3 + 4) = 0;
      *(undefined8 *)((long)&local_168.super_ModelBin._vptr_ModelBin + lVar3 + 4) = 0;
      lVar3 = lVar3 + 0x48;
    } while (lVar3 != 0x160);
    Mat::operator=(&bottom_blob_bordered,&this->weight_data);
    Mat::operator=(&local_110,&this->bias_data);
    if (this->int8_scale_term != 0) {
      Mat::operator=(&local_c8,&this->weight_data_int8_scales);
      Mat::operator=(&local_80,&this->bottom_blob_int8_scales);
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_168,&bottom_blob_bordered);
    (*pLVar2->_vptr_Layer[3])(pLVar2,&local_168);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_168);
    (*pLVar2->_vptr_Layer[4])(pLVar2,opt);
    (*pLVar2->_vptr_Layer[7])(pLVar2,bottom_blob,top_blob,opt);
    (*pLVar2->_vptr_Layer[5])(pLVar2,opt);
    (*pLVar2->_vptr_Layer[1])(pLVar2);
    lVar3 = 0xd8;
    do {
      Mat::~Mat((Mat *)((long)&bottom_blob_bordered.data + lVar3));
      lVar3 = lVar3 + -0x48;
    } while (lVar3 != -0x48);
    ParamDict::~ParamDict(&pd);
    iVar1 = 0;
  }
  else {
    bottom_blob_bordered.cstep = 0;
    bottom_blob_bordered.data = (void *)0x0;
    bottom_blob_bordered.refcount._0_4_ = 0;
    bottom_blob_bordered.refcount._4_4_ = 0;
    bottom_blob_bordered.elemsize._0_4_ = 0;
    bottom_blob_bordered.elemsize._4_4_ = 0;
    bottom_blob_bordered.elempack = 0;
    bottom_blob_bordered.allocator = (Allocator *)0x0;
    bottom_blob_bordered.dims = 0;
    bottom_blob_bordered.w = 0;
    bottom_blob_bordered.h = 0;
    bottom_blob_bordered.d = 0;
    bottom_blob_bordered.c = 0;
    make_padding(this,bottom_blob,&bottom_blob_bordered,opt);
    iVar1 = -100;
    if ((bottom_blob_bordered.data != (void *)0x0) &&
       ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
      Mat::create(top_blob,(~((this->kernel_w + -1) * this->dilation_w) + bottom_blob_bordered.w) /
                           this->stride_w + 1,
                  (~((this->kernel_h + -1) * this->dilation_h) + bottom_blob_bordered.h) /
                  this->stride_h + 1,this->num_output,
                  CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                           (undefined4)bottom_blob_bordered.elemsize),opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar1 = 0;
        convolution(&bottom_blob_bordered,top_blob,&this->weight_data,&this->bias_data,
                    this->kernel_w,this->kernel_h,this->stride_w,this->stride_h,this->dilation_w,
                    this->dilation_h,this->activation_type,&this->activation_params,
                    (Option *)pd._vptr_ParamDict);
      }
    }
    Mat::~Mat(&bottom_blob_bordered);
  }
  return iVar1;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w * bottom_blob.elempack == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);
            pd.set(9, activation_type);
            pd.set(10, activation_params);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

#if NCNN_INT8
            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = bottom_blob_int8_scales;
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            op->destroy_pipeline(opt);

            delete op;

            return 0;
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}